

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

axbStatus_t axbOpBackendRegister_Host(axbHandle_s *handle)

{
  long lVar1;
  long lVar2;
  _func_axbStatus_t_void_ptr *p_Var3;
  axbStatus_t aVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  axbOperationID_t op_id;
  axbOpBackend_s *host_backend;
  axbOperationID_t local_14;
  axbOpBackend_s *local_10;
  
  aVar4 = axbOpBackendCreate(&local_10);
  if (aVar4 == 0) {
    aVar4 = axbOpBackendSetName(local_10,"host");
    if (aVar4 != 0) goto LAB_00106930;
    local_14 = 0;
    aVar4 = axbOpBackendAddOperation(local_10,"op_vec_set",op_vec_set,(void *)0x0,&local_14);
    if (aVar4 == 0) {
      if (local_14 == 0) {
        aVar4 = axbOpBackendAddOperation
                          (local_10,"op_vec_sqrtabs",op_vec_sqrtabs,(void *)0x0,&local_14);
        if (aVar4 == 0) {
          if (local_14 == 1) {
            aVar4 = axbOpBackendAddOperation
                              (local_10,"op_vec_zero",op_vec_zero,(void *)0x0,&local_14);
            if (aVar4 == 0) {
              if (local_14 == 2) {
                aVar4 = axbOpBackendAddOperation
                                  (local_10,"op_vec_scale",op_vec_scale,(void *)0x0,&local_14);
                if (aVar4 == 0) {
                  if (local_14 == 3) {
                    aVar4 = axbOpBackendAddOperation
                                      (local_10,"op_vec_sum",op_vec_sum,(void *)0x0,&local_14);
                    if (aVar4 == 0) {
                      if (local_14 == 4) {
                        aVar4 = axbOpBackendAddOperation
                                          (local_10,"op_vec_dot",op_vec_dot,(void *)0x0,&local_14);
                        if (aVar4 == 0) {
                          if (local_14 == 5) {
                            aVar4 = axbOpBackendAddOperation
                                              (local_10,"op_vec_tdot",op_vec_tdot,(void *)0x0,
                                               &local_14);
                            if (aVar4 == 0) {
                              if (local_14 == 6) {
                                aVar4 = axbOpBackendAddOperation
                                                  (local_10,"op_vec_mdot",op_vec_mdot,(void *)0x0,
                                                   &local_14);
                                if (aVar4 == 0) {
                                  if (local_14 == 7) {
                                    aVar4 = axbOpBackendAddOperation
                                                      (local_10,"op_vec_norm1",op_vec_norm1,
                                                       (void *)0x0,&local_14);
                                    if (aVar4 == 0) {
                                      if (local_14 == 8) {
                                        aVar4 = axbOpBackendAddOperation
                                                          (local_10,"op_vec_norm2",op_vec_norm2,
                                                           (void *)0x0,&local_14);
                                        if (aVar4 == 0) {
                                          if (local_14 == 9) {
                                            aVar4 = axbOpBackendAddOperation
                                                              (local_10,"op_vec_norminf",
                                                               op_vec_norminf,(void *)0x0,&local_14)
                                            ;
                                            if (aVar4 == 0) {
                                              if (local_14 == 10) {
                                                aVar4 = axbOpBackendAddOperation
                                                                  (local_10,"op_vec_dotnorm2",
                                                                   op_vec_dotnorm2,(void *)0x0,
                                                                   &local_14);
                                                if (aVar4 == 0) {
                                                  if (local_14 == 0xb) {
                                                    aVar4 = axbOpBackendAddOperation
                                                                      (local_10,"op_vec_max",
                                                                       op_vec_max,(void *)0x0,
                                                                       &local_14);
                                                    if (aVar4 == 0) {
                                                      if (local_14 == 0xc) {
                                                        aVar4 = axbOpBackendAddOperation
                                                                          (local_10,"op_vec_min",
                                                                           op_vec_min,(void *)0x0,
                                                                           &local_14);
                                                        if (aVar4 == 0) {
                                                          if (local_14 == 0xd) {
                                                            aVar4 = axbOpBackendAddOperation
                                                                              (local_10,
                                                  "op_vec_copy",op_vec_copy,(void *)0x0,&local_14);
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0xe) {
                                                      aVar4 = axbOpBackendAddOperation
                                                                        (local_10,"op_vec_swap",
                                                                         op_vec_swap,(void *)0x0,
                                                                         &local_14);
                                                      if (aVar4 == 0) {
                                                        if (local_14 == 0xf) {
                                                          aVar4 = axbOpBackendAddOperation
                                                                            (local_10,"op_vec_axpy",
                                                                             op_vec_axpy,(void *)0x0
                                                                             ,&local_14);
                                                          if (aVar4 == 0) {
                                                            if (local_14 == 0x10) {
                                                              aVar4 = axbOpBackendAddOperation
                                                                                (local_10,
                                                  "op_vec_aypx",op_vec_aypx,(void *)0x0,&local_14);
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0x11) {
                                                      aVar4 = axbOpBackendAddOperation
                                                                        (local_10,"op_vec_axpbypcz",
                                                                         op_vec_axpbypcz,(void *)0x0
                                                                         ,&local_14);
                                                      if (aVar4 == 0) {
                                                        if (local_14 == 0x12) {
                                                          aVar4 = axbOpBackendAddOperation
                                                                            (local_10,"op_vec_waxpy"
                                                                             ,op_vec_waxpy,
                                                                             (void *)0x0,&local_14);
                                                          if (aVar4 == 0) {
                                                            if (local_14 == 0x13) {
                                                              aVar4 = axbOpBackendAddOperation
                                                                                (local_10,
                                                  "op_vec_maxpy",op_vec_maxpy,(void *)0x0,&local_14)
                                                  ;
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0x14) {
                                                      aVar4 = axbOpBackendAddOperation
                                                                        (local_10,
                                                  "op_vec_pointwisemult",op_vec_pointwisemult,
                                                  (void *)0x0,&local_14);
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0x15) {
                                                      aVar4 = axbOpBackendAddOperation
                                                                        (local_10,
                                                  "op_vec_pointwisediv",op_vec_pointwisediv,
                                                  (void *)0x0,&local_14);
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0x16) {
                                                      aVar4 = axbOpBackendAddOperation
                                                                        (local_10,"op_mat_csr_vec",
                                                                         op_mat_csr_vec,(void *)0x0,
                                                                         &local_14);
                                                      if (aVar4 == 0) {
                                                        if (local_14 == 0x17) {
                                                          aVar4 = axbOpBackendAddOperation
                                                                            (local_10,
                                                  "op_mat_csr_tvec",op_mat_csr_tvec,(void *)0x0,
                                                  &local_14);
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0x18) {
                                                      aVar4 = axbOpBackendAddOperation
                                                                        (local_10,"op_mat_csr_mat",
                                                                         op_mat_csr_mat,(void *)0x0,
                                                                         &local_14);
                                                      if (aVar4 == 0) {
                                                        if (local_14 == 0x19) {
                                                          aVar4 = axbOpBackendAddOperation
                                                                            (local_10,
                                                  "op_mat_csr_trans",op_mat_csr_trans,(void *)0x0,
                                                  &local_14);
                                                  if (aVar4 == 0) {
                                                    if (local_14 == 0x1a) {
                                                      uVar5 = axbOpBackendRegister(handle,local_10);
                                                      if (uVar5 == 0) {
                                                        return 0;
                                                      }
                                                      uVar7 = (ulong)uVar5;
                                                      axbOpBackendRegister_Host_cold_30();
                                                      lVar1 = *(long *)(uVar7 + 0x10);
                                                      if (lVar1 != 0) {
                                                        lVar2 = *(long *)(uVar7 + 0x30);
                                                        p_Var3 = local_10->destroy;
                                                        lVar6 = 0;
                                                        do {
                                                          *(undefined8 *)(lVar2 + lVar6 * 8) =
                                                               *(undefined8 *)p_Var3;
                                                          lVar6 = lVar6 + 1;
                                                        } while (lVar1 != lVar6);
                                                      }
                                                      return 0;
                                                    }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_29();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_MAT_TRANS && \"Logic error: op_id != \" \"AXB_OP_MAT_TRANS\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x252,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_28();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_MAT_MAT && \"Logic error: op_id != \" \"AXB_OP_MAT_MAT\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x251,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_27();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_MAT_TVEC && \"Logic error: op_id != \" \"AXB_OP_MAT_TVEC\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x250,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_26();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_MAT_VEC && \"Logic error: op_id != \" \"AXB_OP_MAT_VEC\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24f,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_25();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_POINTWISEDIV && \"Logic error: op_id != \" \"AXB_OP_VEC_POINTWISEDIV\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24c,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_24();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_POINTWISEMULT && \"Logic error: op_id != \" \"AXB_OP_VEC_POINTWISEMULT\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24b,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_23();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_MAXPY && \"Logic error: op_id != \" \"AXB_OP_VEC_MAXPY\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24a,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_22();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_WAXPY && \"Logic error: op_id != \" \"AXB_OP_VEC_WAXPY\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x249,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_21();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_AXPBYPCZ && \"Logic error: op_id != \" \"AXB_OP_VEC_AXPBYPCZ\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x248,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_20();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_AYPX && \"Logic error: op_id != \" \"AXB_OP_VEC_AYPX\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x247,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_19();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_AXPY && \"Logic error: op_id != \" \"AXB_OP_VEC_AXPY\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x246,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_18();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_SWAP && \"Logic error: op_id != \" \"AXB_OP_VEC_SWAP\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x245,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_17();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_COPY && \"Logic error: op_id != \" \"AXB_OP_VEC_COPY\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x244,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_16();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_MIN && \"Logic error: op_id != \" \"AXB_OP_VEC_MIN\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x241,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    axbOpBackendRegister_Host_cold_15();
                                                  }
                                                  __assert_fail(
                                                  "op_id == AXB_OP_VEC_MAX && \"Logic error: op_id != \" \"AXB_OP_VEC_MAX\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x240,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                }
                                                else {
                                                  axbOpBackendRegister_Host_cold_14();
                                                }
                                                __assert_fail(
                                                  "op_id == AXB_OP_VEC_DOTNORM2 && \"Logic error: op_id != \" \"AXB_OP_VEC_DOTNORM2\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23f,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                              }
                                            }
                                            else {
                                              axbOpBackendRegister_Host_cold_13();
                                            }
                                            __assert_fail(
                                                  "op_id == AXB_OP_VEC_NORMINF && \"Logic error: op_id != \" \"AXB_OP_VEC_NORMINF\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23e,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                          }
                                        }
                                        else {
                                          axbOpBackendRegister_Host_cold_12();
                                        }
                                        __assert_fail(
                                                  "op_id == AXB_OP_VEC_NORM2 && \"Logic error: op_id != \" \"AXB_OP_VEC_NORM2\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23d,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                      }
                                    }
                                    else {
                                      axbOpBackendRegister_Host_cold_11();
                                    }
                                    __assert_fail("op_id == AXB_OP_VEC_NORM1 && \"Logic error: op_id != \" \"AXB_OP_VEC_NORM1\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23c,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                 );
                                  }
                                }
                                else {
                                  axbOpBackendRegister_Host_cold_10();
                                }
                                __assert_fail("op_id == AXB_OP_VEC_MDOT && \"Logic error: op_id != \" \"AXB_OP_VEC_MDOT\""
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                              ,0x23b,
                                              "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                             );
                              }
                            }
                            else {
                              axbOpBackendRegister_Host_cold_9();
                            }
                            __assert_fail("op_id == AXB_OP_VEC_TDOT && \"Logic error: op_id != \" \"AXB_OP_VEC_TDOT\""
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                          ,0x23a,
                                          "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                         );
                          }
                        }
                        else {
                          axbOpBackendRegister_Host_cold_8();
                        }
                        __assert_fail("op_id == AXB_OP_VEC_DOT && \"Logic error: op_id != \" \"AXB_OP_VEC_DOT\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                      ,0x239,
                                      "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)")
                        ;
                      }
                    }
                    else {
                      axbOpBackendRegister_Host_cold_7();
                    }
                    __assert_fail("op_id == AXB_OP_VEC_SUM && \"Logic error: op_id != \" \"AXB_OP_VEC_SUM\""
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                  ,0x238,
                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
                  }
                }
                else {
                  axbOpBackendRegister_Host_cold_6();
                }
                __assert_fail("op_id == AXB_OP_VEC_SCALE && \"Logic error: op_id != \" \"AXB_OP_VEC_SCALE\""
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                              ,0x235,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
              }
            }
            else {
              axbOpBackendRegister_Host_cold_5();
            }
            __assert_fail("op_id == AXB_OP_VEC_ZERO && \"Logic error: op_id != \" \"AXB_OP_VEC_ZERO\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                          ,0x234,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
          }
        }
        else {
          axbOpBackendRegister_Host_cold_4();
        }
        __assert_fail("op_id == AXB_OP_VEC_SQRTABS && \"Logic error: op_id != \" \"AXB_OP_VEC_SQRTABS\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                      ,0x233,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
      }
      goto LAB_0010693e;
    }
  }
  else {
    axbOpBackendRegister_Host_cold_1();
LAB_00106930:
    axbOpBackendRegister_Host_cold_2();
  }
  axbOpBackendRegister_Host_cold_3();
LAB_0010693e:
  __assert_fail("op_id == AXB_OP_VEC_SET && \"Logic error: op_id != \" \"AXB_OP_VEC_SET\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                ,0x232,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
}

Assistant:

axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *handle)
{
  struct axbOpBackend_s *host_backend;
  axbStatus_t status = axbOpBackendCreate(&host_backend); AXB_ERRCHK(status);

  // populate host_backend:
  status = axbOpBackendSetName(host_backend, "host"); AXB_ERRCHK(status);

  axbOperationID_t op_id = 0;

#define AXB_ADD_OPERATION(OPNAME, ENUMCONSTANT)    status = axbOpBackendAddOperation(host_backend, #OPNAME, (axbStatus_t (*)(void))OPNAME, NULL, &op_id); AXB_ERRCHK(status); assert(op_id == ENUMCONSTANT && "Logic error: op_id != " #ENUMCONSTANT)

  // inplace operations
  AXB_ADD_OPERATION(op_vec_set,     AXB_OP_VEC_SET);
  AXB_ADD_OPERATION(op_vec_sqrtabs, AXB_OP_VEC_SQRTABS);
  AXB_ADD_OPERATION(op_vec_zero,    AXB_OP_VEC_ZERO);
  AXB_ADD_OPERATION(op_vec_scale,   AXB_OP_VEC_SCALE);

  // reduction operations
  AXB_ADD_OPERATION(op_vec_sum,      AXB_OP_VEC_SUM);
  AXB_ADD_OPERATION(op_vec_dot,      AXB_OP_VEC_DOT);
  AXB_ADD_OPERATION(op_vec_tdot,     AXB_OP_VEC_TDOT);
  AXB_ADD_OPERATION(op_vec_mdot,     AXB_OP_VEC_MDOT);
  AXB_ADD_OPERATION(op_vec_norm1,    AXB_OP_VEC_NORM1);
  AXB_ADD_OPERATION(op_vec_norm2,    AXB_OP_VEC_NORM2);
  AXB_ADD_OPERATION(op_vec_norminf,  AXB_OP_VEC_NORMINF);
  AXB_ADD_OPERATION(op_vec_dotnorm2, AXB_OP_VEC_DOTNORM2);
  AXB_ADD_OPERATION(op_vec_max,      AXB_OP_VEC_MAX);
  AXB_ADD_OPERATION(op_vec_min,      AXB_OP_VEC_MIN);

  // vector-vector operations
  AXB_ADD_OPERATION(op_vec_copy,          AXB_OP_VEC_COPY);
  AXB_ADD_OPERATION(op_vec_swap,          AXB_OP_VEC_SWAP);
  AXB_ADD_OPERATION(op_vec_axpy,          AXB_OP_VEC_AXPY);
  AXB_ADD_OPERATION(op_vec_aypx,          AXB_OP_VEC_AYPX);
  AXB_ADD_OPERATION(op_vec_axpbypcz,      AXB_OP_VEC_AXPBYPCZ);
  AXB_ADD_OPERATION(op_vec_waxpy,         AXB_OP_VEC_WAXPY);
  AXB_ADD_OPERATION(op_vec_maxpy,         AXB_OP_VEC_MAXPY);
  AXB_ADD_OPERATION(op_vec_pointwisemult, AXB_OP_VEC_POINTWISEMULT);
  AXB_ADD_OPERATION(op_vec_pointwisediv,  AXB_OP_VEC_POINTWISEDIV);

  // matrix operations
  AXB_ADD_OPERATION(op_mat_csr_vec,   AXB_OP_MAT_VEC);
  AXB_ADD_OPERATION(op_mat_csr_tvec,  AXB_OP_MAT_TVEC);
  AXB_ADD_OPERATION(op_mat_csr_mat,   AXB_OP_MAT_MAT);
  AXB_ADD_OPERATION(op_mat_csr_trans, AXB_OP_MAT_TRANS);

#undef AXB_ADD_OPERATION

  // push into enclosing context identified by handle:
  status = axbOpBackendRegister(handle, host_backend); AXB_ERRCHK(status);

  return 0;
}